

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O1

int testString(int param_1,char **param_2)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  string *psVar5;
  int iVar6;
  uint uVar7;
  String str;
  String local_58;
  String local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testConstructDefault()\n",0x17);
  local_58.view_._M_len = 0;
  local_58.view_._M_str = (char *)0x0;
  local_58.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_58.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = cm::String::is_stable(&local_58);
  if (bVar1) {
    pcVar3 = cm::String::c_str(&local_58);
    if (pcVar3 == (char *)0x0) {
      psVar5 = cm::String::str_abi_cxx11_(&local_58);
      if (psVar5->_M_string_length == 0) {
        bVar2 = cm::String::is_stable(&local_58);
        bVar1 = true;
        if (bVar2) goto LAB_001c2ede;
        iVar6 = 0x25;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(str.is_stable()) failed on line ",0x2c);
      }
      else {
        iVar6 = 0x24;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(str.str().empty()) failed on line ",0x2e);
      }
    }
    else {
      iVar6 = 0x23;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.c_str() == nullptr) failed on line ",0x33);
    }
  }
  else {
    iVar6 = 0x22;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str_const.is_stable()) failed on line ",0x32);
  }
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  bVar1 = false;
LAB_001c2ede:
  if (local_58.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  uVar7 = 1;
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"testConstructFromNullPtr()\n",0x1b);
    local_58.string_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_58.string_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58.view_._M_len = 0;
    local_58.view_._M_str = (char *)0x0;
    bVar1 = testFromNullPtr(&local_58);
    if (local_58.string_.
        super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.string_.
                 super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"testConstructFromCStrNull()\n",0x1c);
      cm::IntoString<char_*>::into_string(&local_58,(char *)0x0);
      local_38.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_58.string_.
                super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_38.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_58.string_.
           super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_38.view_._M_len = local_58.view_._M_len;
      local_38.view_._M_str = local_58.view_._M_str;
      bVar1 = testFromCStrNull(&local_38);
      if (local_38.string_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.string_.
                   super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"testConstructFromCharArray()\n",0x1d);
        cm::String::String<char_const(&)[4],void>(&local_58,(char (*) [4])"abc");
        bVar1 = testFromCharArray(&local_58);
        if (local_58.string_.
            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.string_.
                     super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"testConstructFromCStr()\n",0x18);
          cm::IntoString<char_*>::into_string(&local_58,cstr);
          local_38.string_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_58.string_.
                    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_38.string_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               local_58.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_38.view_._M_len = local_58.view_._M_len;
          local_38.view_._M_str = local_58.view_._M_str;
          bVar1 = testFromCStr(&local_38);
          if (local_38.string_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_38.string_.
                       super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"testConstructFromStdString()\n",0x1d);
            cm::String::String<std::__cxx11::string_const&,void>(&local_58,&stdstr_abi_cxx11_);
            bVar1 = testFromStdString(&local_58);
            if (local_58.string_.
                super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_58.string_.
                         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((((((((bVar1) && (bVar1 = testConstructFromView(), bVar1)) &&
                    (bVar1 = testConstructFromChar(), bVar1)) &&
                   ((bVar1 = testConstructFromInitList(), bVar1 &&
                    (bVar1 = testConstructFromBuffer(), bVar1)))) &&
                  (bVar1 = testConstructFromInputIterator(), bVar1)) &&
                 ((((((bVar1 = testConstructFromN(), bVar1 &&
                      (bVar1 = testConstructFromStaticStringView(), bVar1)) &&
                     ((bVar1 = testConstructCopy(), bVar1 &&
                      (((bVar1 = testConstructMove(), bVar1 && (bVar1 = testAssignCopy(), bVar1)) &&
                       (bVar1 = testAssignMove(), bVar1)))))) &&
                    ((bVar1 = testAssignFromChar(), bVar1 && (bVar1 = testAssignFromView(), bVar1)))
                    ) && ((bVar1 = testAssignFromStdString(), bVar1 &&
                          (((bVar1 = testAssignFromCStr(), bVar1 &&
                            (bVar1 = testAssignFromCharArray(), bVar1)) &&
                           ((bVar1 = testAssignFromCStrNull(), bVar1 &&
                            (((bVar1 = testAssignFromNullPtr(), bVar1 &&
                              (bVar1 = testAssignFromInitList(), bVar1)) &&
                             (bVar1 = testAssignFromStaticStringView(), bVar1)))))))))) &&
                  (((bVar1 = testOperatorBool(), bVar1 && (bVar1 = testOperatorIndex(), bVar1)) &&
                   (bVar1 = testOperatorPlusEqual(), bVar1)))))) &&
                (((bVar1 = testOperatorCompare(), bVar1 && (bVar1 = testOperatorStream(), bVar1)) &&
                 ((bVar1 = testOperatorStdStringPlusEqual(), bVar1 &&
                  ((((bVar1 = testMethod_borrow(), bVar1 && (bVar1 = testMethod_view(), bVar1)) &&
                    (bVar1 = testMethod_empty(), bVar1)) &&
                   ((bVar1 = testMethod_length(), bVar1 && (bVar1 = testMethod_at(), bVar1))))))))))
               && ((((bVar1 = testMethod_front_back(), bVar1 &&
                     ((bVar1 = testMethod_clear(), bVar1 && (bVar1 = testMethod_insert(), bVar1))))
                    && ((((bVar1 = testMethod_erase(), bVar1 &&
                          (((bVar1 = testMethod_push_back(), bVar1 &&
                            (bVar1 = testMethod_pop_back(), bVar1)) &&
                           (bVar1 = testMethod_replace(), bVar1)))) &&
                         (((bVar1 = testMethod_copy(), bVar1 && (bVar1 = testMethod_resize(), bVar1)
                           ) && (bVar1 = testMethod_swap(), bVar1)))) &&
                        ((bVar1 = testMethodIterators(), bVar1 &&
                         (bVar1 = testMethod_substr_AtEndBorrowed(), bVar1)))))) &&
                   ((((bVar1 = testMethod_substr_AtEndOwned(), bVar1 &&
                      (((bVar1 = testMethod_substr_AtStartBorrowed(), bVar1 &&
                        (bVar1 = testMethod_substr_AtStartOwned(), bVar1)) &&
                       (bVar1 = testMethod_compare(), bVar1)))) &&
                     ((bVar1 = testMethod_find(), bVar1 && (bVar1 = testMethod_rfind(), bVar1)))) &&
                    ((bVar1 = testMethod_find_first_of(), bVar1 &&
                     (((bVar1 = testMethod_find_first_not_of(), bVar1 &&
                       (bVar1 = testMethod_find_last_of(), bVar1)) &&
                      ((bVar1 = testMethod_find_last_not_of(), bVar1 &&
                       (bVar1 = testAddition(), bVar1)))))))))))) {
              bVar1 = testStability();
              uVar7 = (uint)!bVar1;
            }
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}